

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

double VP8SSIMFromStatsClipped(VP8DistoStats *stats)

{
  double dVar1;
  
  dVar1 = SSIMCalculation(stats,stats->w);
  return dVar1;
}

Assistant:

double VP8SSIMFromStatsClipped(const VP8DistoStats* const stats) {
  return SSIMCalculation(stats, stats->w);
}